

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.h
# Opt level: O3

void __thiscall leveldb::test::Tester::~Tester(Tester *this)

{
  uint uVar1;
  char *pcVar2;
  FILE *__stream;
  undefined8 local_40 [4];
  
  __stream = _stderr;
  if (this->ok_ != false) {
    std::__cxx11::stringstream::~stringstream((stringstream *)&this->ss_);
    std::ios_base::~ios_base((ios_base *)&this->field_0x98);
    return;
  }
  pcVar2 = this->fname_;
  uVar1 = this->line_;
  std::__cxx11::stringstream::str();
  fprintf(__stream,"%s:%d:%s\n",pcVar2,(ulong)uVar1,local_40[0]);
  std::__cxx11::string::~string((string *)local_40);
  exit(1);
}

Assistant:

~Tester() {
    if (!ok_) {
      fprintf(stderr, "%s:%d:%s\n", fname_, line_, ss_.str().c_str());
      exit(1);
    }
  }